

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TDeletingArray<FRandom_*,_FRandom_*>::~TDeletingArray(TDeletingArray<FRandom_*,_FRandom_*> *this)

{
  FRandom *pFVar1;
  FRandom *pFVar2;
  uint uVar3;
  FRandom **ppFVar4;
  ulong uVar5;
  
  uVar3 = (this->super_TArray<FRandom_*,_FRandom_*>).Count;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      pFVar1 = (this->super_TArray<FRandom_*,_FRandom_*>).Array[uVar5];
      if (pFVar1 != (FRandom *)0x0) {
        ppFVar4 = &FRandom::RNGList;
        do {
          pFVar2 = *ppFVar4;
          ppFVar4 = &pFVar2->Next;
          if (pFVar2 == (FRandom *)0x0) break;
        } while (pFVar2 != pFVar1);
        if (pFVar2 != (FRandom *)0x0) {
          FRandom::RNGList = *ppFVar4;
        }
        operator_delete(pFVar1,0x70);
        uVar3 = (this->super_TArray<FRandom_*,_FRandom_*>).Count;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  TArray<FRandom_*,_FRandom_*>::~TArray(&this->super_TArray<FRandom_*,_FRandom_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}